

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputeFirstOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  int in_EDI;
  int i;
  int j;
  double norm;
  int a1;
  int a0;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  if ((in_EDI < 1) || (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    iVar1 = in_EDI * 2 + 1;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar2 != (long)iVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
    local_28 = 0;
    for (local_24 = -in_EDI; local_24 <= in_EDI; local_24 = local_24 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_28);
      *pvVar3 = (double)local_24 * (1.0 / (double)((iVar1 * in_EDI * (in_EDI + 1)) / 3));
      local_28 = local_28 + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ComputeFirstOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const double norm(1.0 / a1);
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = j * norm;
  }
  return true;
}